

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::visitAtomicRMW(I64ToI32Lowering *this,AtomicRMW *curr)

{
  Builder *this_00;
  Builder *pBVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  bool bVar4;
  Expression *value;
  Expression *value_00;
  LocalSet *pLVar5;
  LocalSet *pLVar6;
  Block *expression;
  MixedArena *pMVar7;
  initializer_list<wasm::Expression_*> __l;
  undefined1 local_f0 [8];
  TempVar highBits;
  char local_c0;
  undefined1 local_b0 [8];
  TempVar lowBits;
  long local_80;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_78;
  Expression *local_60;
  Expression *local_58;
  undefined4 *local_50;
  uintptr_t local_40;
  allocator_type local_31;
  
  bVar4 = handleUnreachable(this,(Expression *)curr);
  if ((bVar4) ||
     ((curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id != 3)) {
    return;
  }
  getTemp((TempVar *)local_b0,this,(Type)0x2);
  getTemp((TempVar *)local_f0,this,(Type)0x2);
  uVar3 = DAT_00dbdbb0;
  uVar2 = ABI::wasm2js::ATOMIC_RMW_I64;
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)Builder::makeConst<int>(this_00,curr->op);
  local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)Builder::makeConst<int>
                          ((this->builder)._M_t.
                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                           .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                           (uint)curr->bytes);
  local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)Builder::makeConst<int>
                          ((this->builder)._M_t.
                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                           .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                           (int)(curr->offset).addr);
  local_40 = uVar3;
  local_60 = curr->ptr;
  local_58 = curr->value;
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  fetchOutParam((TempVar *)&highBits.ty,this,local_58);
  if (local_c0 != '\x01') {
    local_50 = (undefined4 *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
    *local_50 = 8;
    local_50[4] = (undefined4)highBits.ty.id;
    *(undefined8 *)(local_50 + 2) = 2;
    __l._M_len = 6;
    __l._M_array = (iterator)&local_78;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&lowBits.ty,__l,
               &local_31);
    pMVar7 = &this_00->wasm->allocator;
    value = (Expression *)MixedArena::allocSpace(pMVar7,0x48,8);
    value->_id = CallId;
    (value->type).id = 0;
    *(undefined8 *)(value + 1) = 0;
    value[1].type.id = 0;
    *(undefined8 *)(value + 2) = 0;
    value[2].type.id = (uintptr_t)pMVar7;
    *(undefined8 *)(value + 3) = 0;
    value[3].type.id = 0;
    *(undefined1 *)&value[4]._id = InvalidId;
    (value->type).id = 2;
    *(undefined8 *)(value + 3) = uVar2;
    value[3].type.id = local_40;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(value + 1),
               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&lowBits.ty);
    *(undefined1 *)&value[4]._id = InvalidId;
    if (lowBits.ty.id != 0) {
      operator_delete((void *)lowBits.ty.id,local_80 - lowBits.ty.id);
    }
    TempVar::~TempVar((TempVar *)&highBits.ty);
    uVar2 = ABI::wasm2js::GET_STASHED_BITS;
    local_40 = DAT_00dbdbc0;
    local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pMVar7 = &((this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->allocator;
    value_00 = (Expression *)MixedArena::allocSpace(pMVar7,0x48,8);
    value_00->_id = CallId;
    (value_00->type).id = 0;
    *(undefined8 *)(value_00 + 1) = 0;
    value_00[1].type.id = 0;
    *(undefined8 *)(value_00 + 2) = 0;
    value_00[2].type.id = (uintptr_t)pMVar7;
    *(undefined8 *)(value_00 + 3) = 0;
    value_00[3].type.id = 0;
    *(undefined1 *)&value_00[4]._id = InvalidId;
    (value_00->type).id = 2;
    *(undefined8 *)(value_00 + 3) = uVar2;
    value_00[3].type.id = local_40;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(value_00 + 1),
               &local_78);
    *(undefined1 *)&value_00[4]._id = InvalidId;
    if ((Const *)local_78.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start != (Const *)0x0) {
      operator_delete(local_78.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((((char)lowBits.pass != '\x01') &&
        (pLVar5 = Builder::makeLocalSet
                            ((this->builder)._M_t.
                             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                             .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                             local_b0._0_4_,value), (char)highBits.pass != '\x01')) &&
       (pLVar6 = Builder::makeLocalSet
                           ((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                            local_f0._0_4_,value_00), (char)lowBits.pass != '\x01')) {
      local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)MixedArena::allocSpace
                              (&((this->builder)._M_t.
                                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                 .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm
                                ->allocator,0x18,8);
      *(undefined4 *)
       local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = 8;
      *(undefined4 *)
       (local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage + 2) = local_b0._0_4_;
      local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[1] = (Expression *)0x2;
      highBits.ty.id = (uintptr_t)&local_78;
      local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pLVar5;
      local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pLVar6;
      expression = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             ((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                              (initializer_list<wasm::Expression_*> *)&highBits.ty);
      local_78.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)expression;
      std::
      _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->highBitVars,&local_78,local_f0);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      TempVar::~TempVar((TempVar *)local_f0);
      TempVar::~TempVar((TempVar *)local_b0);
      return;
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4c,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void visitAtomicRMW(AtomicRMW* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (curr->type != Type::i64) {
      return;
    }
    // We cannot break this up into smaller operations as it must be atomic.
    // Lower to an instrinsic function that wasm2js will implement.
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    auto* getLow = builder->makeCall(
      ABI::wasm2js::ATOMIC_RMW_I64,
      {builder->makeConst(int32_t(curr->op)),
       builder->makeConst(int32_t(curr->bytes)),
       builder->makeConst(int32_t(curr->offset)),
       curr->ptr,
       curr->value,
       builder->makeLocalGet(fetchOutParam(curr->value), Type::i32)},
      Type::i32);
    auto* getHigh =
      builder->makeCall(ABI::wasm2js::GET_STASHED_BITS, {}, Type::i32);
    auto* setLow = builder->makeLocalSet(lowBits, getLow);
    auto* setHigh = builder->makeLocalSet(highBits, getHigh);
    auto* finalGet = builder->makeLocalGet(lowBits, Type::i32);
    auto* result = builder->makeBlock({setLow, setHigh, finalGet});
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }